

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O3

unsigned_long __thiscall CTPNStmWhileBase::get_control_flow(CTPNStmWhileBase *this,int warn)

{
  CTPNStm *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar3;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  ulong uVar4;
  undefined4 extraout_var_01;
  
  iVar2 = (*(this->cond_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var,iVar2) != 0) {
    iVar2 = (*(this->cond_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    if ((((((CTcConstVal *)CONCAT44(extraout_var_00,iVar2))->typ_ == TC_CVT_NIL) ||
         (iVar2 = CTcConstVal::equals_zero((CTcConstVal *)CONCAT44(extraout_var_00,iVar2)),
         iVar2 != 0)) && (this->body_stm_ != (CTPNStm *)0x0)) &&
       ((iVar2 = (*(this->body_stm_->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase.
                   _vptr_CTcPrsNodeBase[0x1d])(), iVar2 == 0 && ((G_prs->field_0xec & 4) != 0)))) {
      if (warn == 0) {
        return 1;
      }
      iVar2 = (*(this->cond_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
      if ((*(byte *)(CONCAT44(extraout_var_05,iVar2) + 0x20) & 1) != 0) {
        return 1;
      }
      CTPNStmBase::log_warning((CTPNStmBase *)this,0x2b41);
      return 1;
    }
  }
  pCVar1 = this->body_stm_;
  if (pCVar1 == (CTPNStm *)0x0) {
    uVar3 = 0;
  }
  else {
    iVar2 = (*(pCVar1->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
              [0x1c])(pCVar1,warn);
    uVar3 = CONCAT44(extraout_var_01,iVar2);
  }
  iVar2 = (*(this->cond_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
  if (CONCAT44(extraout_var_02,iVar2) != 0) {
    uVar4 = (ulong)((uint)(uVar3 >> 5) & 1);
    iVar2 = (*(this->cond_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    if (CONCAT44(extraout_var_03,iVar2) == 0) goto LAB_0023a103;
    iVar2 = (*(this->cond_expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[1])();
    if ((((CTcConstVal *)CONCAT44(extraout_var_04,iVar2))->typ_ != TC_CVT_NIL) &&
       (iVar2 = CTcConstVal::equals_zero((CTcConstVal *)CONCAT44(extraout_var_04,iVar2)), iVar2 == 0
       )) goto LAB_0023a103;
  }
  uVar4 = 1;
LAB_0023a103:
  return uVar3 & 0xffffffffffffff9e | uVar4;
}

Assistant:

unsigned long CTPNStmWhileBase::get_control_flow(int warn) const
{
    unsigned long flags;

    /*
     *   If we have a condition with a constant false value, and we have a
     *   non-empty body, and the body isn't reachable via a label, warn
     *   about the unreachable code 
     */
    if (cond_expr_->is_const()
        && !cond_expr_->get_const_val()->get_val_bool()
        && body_stm_ != 0
        && !body_stm_->has_code_label()
        && G_prs->get_syntax_only())
    {
        /* log a warning if desired */
        if (warn && !cond_expr_->get_const_val()->is_ctc())
            log_warning(TCERR_WHILE_COND_FALSE);

        /* this will simply continue to the next statement */
        return TCPRS_FLOW_NEXT;
    }

    /* check for a body */
    if (body_stm_ != 0)
    {
        /* determine how our body can exit */
        flags = body_stm_->get_control_flow(warn);
    }
    else
    {
        /* 
         *   We have no body, so it's entirely up to the loop - we'll
         *   evaluate those parameters below, but for now clear all flags 
         */
        flags = 0;
    }

    /* 
     *   ignore any 'next' flag that comes out of the body, because 'next'
     *   from the last statement in the body actually takes us back to the
     *   top of the loop 
     */
    flags &= ~TCPRS_FLOW_NEXT;

    /* 
     *   if there's a 'break' in the body, we can continue to the next
     *   statement, since a break in the body takes us to the statement
     *   after the 'for' 
     */
    if ((flags & TCPRS_FLOW_BREAK) != 0)
        flags |= TCPRS_FLOW_NEXT;

    /* 
     *   if the condition is a constant false value, or has a non-constant
     *   value, assume that the condition can possibly become false and
     *   hence that the loop can exit, and hence that the next statement
     *   is reachable 
     */
    if (!cond_expr_->is_const()
        || (cond_expr_->is_const()
            && !cond_expr_->get_const_val()->get_val_bool()))
        flags |= TCPRS_FLOW_NEXT;

    /* 
     *   clear the 'break' and 'continue' flags, since we capture them in
     *   our own scope - if our child breaks or continues, it won't affect
     *   the loop's container 
     */
    flags &= ~(TCPRS_FLOW_BREAK | TCPRS_FLOW_CONT);

    /* return the flags */
    return flags;
}